

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O3

int ON_JoinCurvesOld(ON_SimpleArray<const_ON_Curve_*> *InCurves,
                    ON_SimpleArray<ON_Curve_*> *OutCurves,double join_tol,bool bPreserveDirection,
                    ON_SimpleArray<int> *key)

{
  ON_SimpleArray<OldCurveJoinSeg> *SArray;
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  OldCurveJoinEndData *pOVar9;
  ulong uVar10;
  void *pvVar11;
  long lVar12;
  ON_SimpleArray<OldCurveJoinSeg> *pOVar13;
  OldCurveJoinSeg *pOVar14;
  OldCurveJoinSeg *pOVar15;
  int *piVar16;
  ON_PolyCurve *this;
  ON_NurbsCurve *pOVar17;
  ON_PolyCurve *this_00;
  ON_Curve *pOVar18;
  undefined4 extraout_var_00;
  double *pdVar19;
  long lVar20;
  undefined7 in_register_00000011;
  int si;
  ON_SimpleArray<ON_Curve_*> *pOVar21;
  size_t new_capacity;
  ulong uVar22;
  ON_SimpleArray<int> *pOVar23;
  ON_SimpleArray<OldCurveJoinSeg> *this_01;
  long lVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ON_Curve *C_1;
  ON_SimpleArray<ON_Curve_*> IC;
  OldCurveJoinSeg Seg;
  ON_SimpleArray<OldCurveJoinEndData> EData;
  ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_> SegsArray;
  ON_SimpleArray<int> cmap;
  ON_3dPointArray Start;
  ON_3dPointArray End;
  ON_3dPoint Q;
  uint local_1ac;
  void *local_1a8;
  ON_SimpleArray<int> *local_1a0;
  double local_198;
  ON_NurbsCurve *local_190;
  int local_184;
  ON_SimpleArray<ON_Curve_*> local_180;
  undefined1 local_168 [8];
  double dStack_160;
  double local_158;
  double local_148;
  undefined4 local_13c;
  undefined1 local_138 [16];
  double local_128;
  ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_> local_120;
  ON_SimpleArray<int> local_108;
  int local_ec;
  ON_SimpleArray<ON_3dPoint> local_e8;
  void *local_d0;
  ON_SimpleArray<ON_Curve_*> *local_c8;
  ON_SimpleArray<ON_3dPoint> local_c0;
  ON_3dPoint local_a8;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  local_13c = (undefined4)CONCAT71(in_register_00000011,bPreserveDirection);
  if (InCurves->m_count < 1) {
    return 0;
  }
  local_ec = OutCurves->m_count;
  local_148 = join_tol;
  iVar6 = (*((*InCurves->m_a)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
  uVar8 = InCurves->m_count;
  lVar25 = 1;
  if (1 < (int)uVar8) {
    lVar25 = 1;
    do {
      iVar7 = (*(InCurves->m_a[lVar25]->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
      if (iVar7 != iVar6) {
        return 0;
      }
      lVar25 = lVar25 + 1;
      uVar8 = InCurves->m_count;
    } while (lVar25 < (int)uVar8);
  }
  local_1ac = (uint)lVar25;
  if (key != (ON_SimpleArray<int> *)0x0) {
    if ((uint)key->m_capacity < uVar8) {
      ON_SimpleArray<int>::SetCapacity(key,(long)(int)uVar8);
      uVar8 = InCurves->m_count;
    }
    local_1ac = 0;
    if (0 < (int)uVar8) {
      do {
        local_180._vptr_ON_SimpleArray =
             (_func_int **)CONCAT44(local_180._vptr_ON_SimpleArray._4_4_,0xffffffff);
        ON_SimpleArray<int>::Append(key,(int *)&local_180);
        local_1ac = local_1ac + 1;
        uVar8 = InCurves->m_count;
      } while ((int)local_1ac < (int)uVar8);
    }
  }
  if ((uint)OutCurves->m_capacity < uVar8) {
    ON_SimpleArray<ON_Curve_*>::SetCapacity(OutCurves,(long)(int)uVar8);
    uVar8 = InCurves->m_count;
  }
  local_180._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080bda0;
  local_180.m_a = (ON_Curve **)0x0;
  local_180.m_count = 0;
  local_180.m_capacity = 0;
  local_1a0 = key;
  if (uVar8 != 0) {
    ON_SimpleArray<ON_Curve_*>::SetCapacity(&local_180,(long)(int)uVar8);
    local_108._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
    local_108.m_a = (int *)0x0;
    local_108.m_count = 0;
    local_108.m_capacity = 0;
    if ((long)InCurves->m_count != 0) {
      ON_SimpleArray<int>::SetCapacity(&local_108,(long)InCurves->m_count);
      local_1ac = 0;
      if (0 < InCurves->m_count) {
        do {
          iVar6 = (*(InCurves->m_a[(int)local_1ac]->super_ON_Geometry).super_ON_Object.
                    _vptr_ON_Object[0x24])();
          local_e8._vptr_ON_SimpleArray = (_func_int **)CONCAT44(extraout_var,iVar6);
          if (local_e8._vptr_ON_SimpleArray != (_func_int **)0x0) {
            cVar4 = (**(code **)(*local_e8._vptr_ON_SimpleArray + 0x1a0))
                              (local_e8._vptr_ON_SimpleArray);
            if (cVar4 == '\0') {
              ON_SimpleArray<int>::Append(&local_108,(int *)&local_1ac);
              pOVar21 = &local_180;
            }
            else {
              pOVar21 = OutCurves;
              if (local_1a0 != (ON_SimpleArray<int> *)0x0) {
                local_1a0->m_a[(int)local_1ac] = OutCurves->m_count;
              }
            }
            ON_SimpleArray<ON_Curve_*>::Append(pOVar21,(ON_Curve **)&local_e8);
          }
          local_1ac = local_1ac + 1;
        } while ((int)local_1ac < InCurves->m_count);
      }
      goto LAB_00428863;
    }
  }
  local_108.m_count = 0;
  local_108.m_capacity = 0;
  local_108.m_a = (int *)0x0;
  local_108._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
  local_1ac = 0;
LAB_00428863:
  ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_e8,local_180.m_count);
  if ((-1 < local_180.m_count) && (local_180.m_count <= local_e8.m_capacity)) {
    local_e8.m_count = local_180.m_count;
  }
  ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_c0,local_180.m_count);
  pOVar23 = local_1a0;
  if ((-1 < local_180.m_count) && (local_180.m_count <= local_c0.m_capacity)) {
    local_c0.m_count = local_180.m_count;
  }
  local_1ac = 0;
  if (0 < local_180.m_count) {
    do {
      ON_Curve::PointAtStart((ON_3dPoint *)local_138,local_180.m_a[(int)local_1ac]);
      lVar25 = (long)(int)local_1ac;
      local_e8.m_a[lVar25].z = local_128;
      local_e8.m_a[lVar25].x = (double)local_138._0_8_;
      local_e8.m_a[lVar25].y = (double)local_138._8_8_;
      ON_Curve::PointAtEnd((ON_3dPoint *)local_138,local_180.m_a[lVar25]);
      local_c0.m_a[(int)local_1ac].z = local_128;
      local_c0.m_a[(int)local_1ac].x = (double)local_138._0_8_;
      local_c0.m_a[(int)local_1ac].y = (double)local_138._8_8_;
      local_1ac = local_1ac + 1;
    } while ((int)local_1ac < local_180.m_count);
  }
  local_138._0_8_ = &PTR__ON_SimpleArray_0080dde0;
  local_138._8_8_ = (OldCurveJoinEndData *)0x0;
  local_128 = 0.0;
  if (local_180.m_count == 0) {
    local_1ac = 0;
    iVar6 = 0;
  }
  else {
    ON_SimpleArray<OldCurveJoinEndData>::SetCapacity
              ((ON_SimpleArray<OldCurveJoinEndData> *)local_138,(long)local_180.m_count);
    uVar10 = local_180._16_8_ & 0xffffffff;
    local_1ac = 0;
    iVar6 = local_180.m_count;
    if (0 < local_180.m_count) {
      do {
        if (0 < (int)uVar10) {
          lVar25 = 0;
          uVar22 = 0;
          do {
            if (uVar22 != local_1ac) {
              local_198 = ON_3dPoint::DistanceTo
                                    (local_e8.m_a + (int)local_1ac,
                                     (ON_3dPoint *)((long)&(local_c0.m_a)->x + lVar25));
              iVar6 = (int)uVar22;
              if (local_198 <= local_148) {
                pOVar9 = ON_SimpleArray<OldCurveJoinEndData>::AppendNew
                                   ((ON_SimpleArray<OldCurveJoinEndData> *)local_138);
                pOVar9->id[0] = local_1ac;
                pOVar9->end[0] = 0;
                pOVar9->end[1] = 1;
                pOVar9->id[1] = iVar6;
                pOVar9->dist = local_198;
              }
              if (((char)local_13c == '\0') && ((long)(int)local_1ac < (long)uVar22)) {
                local_198 = ON_3dPoint::DistanceTo
                                      (local_e8.m_a + (int)local_1ac,
                                       (ON_3dPoint *)((long)&(local_e8.m_a)->x + lVar25));
                if (local_198 <= local_148) {
                  pOVar9 = ON_SimpleArray<OldCurveJoinEndData>::AppendNew
                                     ((ON_SimpleArray<OldCurveJoinEndData> *)local_138);
                  pOVar9->id[0] = local_1ac;
                  pOVar9->end[0] = 0;
                  pOVar9->end[1] = 0;
                  pOVar9->id[1] = iVar6;
                  pOVar9->dist = local_198;
                }
                local_198 = ON_3dPoint::DistanceTo
                                      (local_c0.m_a + (int)local_1ac,
                                       (ON_3dPoint *)((long)&(local_c0.m_a)->x + lVar25));
                if (local_198 <= local_148) {
                  pOVar9 = ON_SimpleArray<OldCurveJoinEndData>::AppendNew
                                     ((ON_SimpleArray<OldCurveJoinEndData> *)local_138);
                  pOVar9->id[0] = local_1ac;
                  pOVar9->end[0] = 1;
                  pOVar9->end[1] = 1;
                  pOVar9->id[1] = iVar6;
                  pOVar9->dist = local_198;
                }
              }
            }
            uVar22 = uVar22 + 1;
            uVar10 = (ulong)local_180.m_count;
            lVar25 = lVar25 + 0x18;
            pOVar23 = local_1a0;
          } while ((long)uVar22 < (long)uVar10);
        }
        local_1ac = local_1ac + 1;
        iVar6 = (int)uVar10;
      } while ((int)local_1ac < iVar6);
    }
  }
  if ((OldCurveJoinEndData *)local_138._8_8_ != (OldCurveJoinEndData *)0x0) {
    if (1 < (long)local_128._0_4_) {
      ON_qsort((void *)local_138._8_8_,(long)local_128._0_4_,0x18,OldCompareEndData);
      iVar6 = local_180.m_count;
    }
  }
  local_d0 = onmalloc((long)iVar6 << 3);
  memset(local_d0,0,(long)local_180.m_count << 3);
  pvVar11 = onmalloc((long)local_180.m_count << 3);
  auVar3 = _DAT_0069b120;
  new_capacity = (size_t)local_180.m_count;
  local_1ac = 0;
  if (0 < (long)new_capacity) {
    lVar25 = new_capacity - 1;
    auVar26._8_4_ = (int)lVar25;
    auVar26._0_8_ = lVar25;
    auVar26._12_4_ = (int)((ulong)lVar25 >> 0x20);
    lVar25 = 0;
    auVar26 = auVar26 ^ _DAT_0069b120;
    auVar27 = _DAT_0069b170;
    do {
      auVar28 = auVar27 ^ auVar3;
      lVar12 = auVar27._8_8_;
      if ((bool)(~(auVar28._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar28._0_4_ ||
                  auVar26._4_4_ < auVar28._4_4_) & 1)) {
        *(void **)((long)pvVar11 + lVar25) = (void *)(auVar27._0_8_ * 8 + (long)local_d0);
      }
      if ((auVar28._12_4_ != auVar26._12_4_ || auVar28._8_4_ <= auVar26._8_4_) &&
          auVar28._12_4_ <= auVar26._12_4_) {
        *(void **)((long)pvVar11 + lVar25 + 8) = (void *)(lVar12 * 8 + (long)local_d0);
      }
      auVar27._0_8_ = auVar27._0_8_ + 2;
      auVar27._8_8_ = lVar12 + 2;
      lVar25 = lVar25 + 0x10;
      local_1ac = local_180.m_count;
    } while ((ulong)(local_180.m_count + 1U >> 1) << 4 != lVar25);
  }
  local_120._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_0080de20;
  local_120.m_a = (ON_SimpleArray<OldCurveJoinSeg> *)0x0;
  local_120.m_count = 0;
  local_120.m_capacity = 0;
  local_c8 = OutCurves;
  if (local_180.m_count != 0) {
    ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_>::SetCapacity(&local_120,new_capacity);
  }
  local_1ac = 0;
  local_1a8 = pvVar11;
  if (0 < local_128._0_4_) {
    do {
      pOVar13 = local_120.m_a;
      lVar12 = (long)(int)local_1ac;
      lVar25 = *(long *)((long)pvVar11 +
                        (long)((OldCurveJoinEndData *)(local_138._8_8_ + lVar12 * 0x18))->id[0] * 8)
      ;
      if (*(int *)(lVar25 + (long)((OldCurveJoinEndData *)(local_138._8_8_ + lVar12 * 0x18))->end[0]
                            * 4) < 1) {
        pOVar9 = (OldCurveJoinEndData *)(local_138._8_8_ + lVar12 * 0x18);
        iVar6 = pOVar9->id[1];
        lVar24 = *(long *)((long)pvVar11 + (long)iVar6 * 8);
        lVar20 = (long)pOVar9->end[1];
        if (*(int *)(lVar24 + lVar20 * 4) < 1) {
          iVar7 = *(int *)(lVar25 + (1 - (long)((OldCurveJoinEndData *)
                                               (local_138._8_8_ + lVar12 * 0x18))->end[0]) * 4);
          lVar25 = (long)iVar7;
          iVar1 = *(int *)(lVar24 + (long)(1 - pOVar9->end[1]) * 4);
          pvVar11 = local_1a8;
          if (lVar25 == 0) {
            if (iVar1 == 0) {
              *(int *)(lVar24 + lVar20 * 4) = local_120.m_count + 1;
              *(int *)(*(long *)((long)local_1a8 + (long)pOVar9->id[0] * 8) +
                      (long)pOVar9->end[0] * 4) = local_120.m_count + 1;
              pOVar13 = ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_>::AppendNew(&local_120);
              if ((uint)pOVar13->m_capacity < 4) {
                ON_SimpleArray<OldCurveJoinSeg>::SetCapacity(pOVar13,4);
              }
              pOVar14 = ON_SimpleArray<OldCurveJoinSeg>::AppendNew(pOVar13);
              pOVar15 = ON_SimpleArray<OldCurveJoinSeg>::AppendNew(pOVar13);
              if (pOVar9->end[0] != 0) {
                pOVar14->id = pOVar9->id[0];
                pOVar14->bRev = false;
                goto LAB_00428f59;
              }
              pOVar15->id = pOVar9->id[0];
              pOVar15->bRev = false;
              pOVar14->id = pOVar9->id[1];
              pOVar14->bRev = pOVar9->end[1] == 0;
            }
            else {
              *(int *)(lVar24 + lVar20 * 4) = iVar1;
              *(int *)(*(long *)((long)local_1a8 + (long)pOVar9->id[0] * 8) +
                      (long)pOVar9->end[0] * 4) = iVar1;
              if ((local_120.m_a[(long)iVar1 + -1].m_a)->id == pOVar9->id[1]) {
                local_168[4] = pOVar9->end[0] == 0;
                local_168._0_4_ = pOVar9->id[0];
                ON_SimpleArray<OldCurveJoinSeg>::Insert
                          (local_120.m_a + (long)iVar1 + -1,0,(OldCurveJoinSeg *)local_168);
                pvVar11 = local_1a8;
              }
              else {
                pOVar14 = ON_SimpleArray<OldCurveJoinSeg>::AppendNew
                                    (local_120.m_a + (long)iVar1 + -1);
                pOVar14->id = pOVar9->id[0];
                pOVar14->bRev = pOVar9->end[0] != 0;
                pvVar11 = local_1a8;
              }
            }
          }
          else if (iVar1 == 0) {
            *(int *)(lVar24 + lVar20 * 4) = iVar7;
            *(int *)(*(long *)((long)local_1a8 + (long)pOVar9->id[0] * 8) + (long)pOVar9->end[0] * 4
                    ) = iVar7;
            if ((local_120.m_a[lVar25 + -1].m_a)->id == pOVar9->id[0]) {
              local_168[4] = pOVar9->end[1] == 0;
              local_168._0_4_ = pOVar9->id[1];
              ON_SimpleArray<OldCurveJoinSeg>::Insert
                        (local_120.m_a + lVar25 + -1,0,(OldCurveJoinSeg *)local_168);
            }
            else {
              pOVar15 = ON_SimpleArray<OldCurveJoinSeg>::AppendNew(local_120.m_a + lVar25 + -1);
LAB_00428f59:
              pOVar15->id = pOVar9->id[1];
              pOVar15->bRev = pOVar9->end[1] != 0;
            }
          }
          else if (iVar7 == iVar1) {
            *(int *)(lVar24 + lVar20 * 4) = iVar7;
            *(int *)(*(long *)((long)local_1a8 + (long)pOVar9->id[0] * 8) + (long)pOVar9->end[0] * 4
                    ) = iVar7;
          }
          else {
            this_01 = local_120.m_a + lVar25 + -1;
            SArray = local_120.m_a + (long)iVar1 + -1;
            iVar2 = SArray->m_a->id;
            if ((local_120.m_a[lVar25 + -1].m_a)->id ==
                ((OldCurveJoinEndData *)(local_138._8_8_ + lVar12 * 0x18))->id[0]) {
              if (iVar2 != iVar6) {
                if (0 < local_120.m_a[lVar25 + -1].m_count) {
                  lVar24 = 0;
                  lVar12 = 0;
                  do {
                    pOVar14 = (OldCurveJoinSeg *)((long)&(pOVar13[lVar25 + -1].m_a)->id + lVar24);
                    piVar16 = *(int **)((long)local_1a8 +
                                       (long)*(int *)((long)&(pOVar13[lVar25 + -1].m_a)->id + lVar24
                                                     ) * 8);
                    if (0 < *piVar16) {
                      *piVar16 = iVar1;
                      piVar16 = *(int **)((long)local_1a8 + (long)pOVar14->id * 8);
                    }
                    if (0 < piVar16[1]) {
                      piVar16[1] = iVar1;
                    }
                    ON_SimpleArray<OldCurveJoinSeg>::Append(SArray,pOVar14);
                    lVar12 = lVar12 + 1;
                    lVar24 = lVar24 + 8;
                  } while (lVar12 < pOVar13[lVar25 + -1].m_count);
                  lVar24 = *(long *)((long)local_1a8 + (long)pOVar9->id[1] * 8);
                  lVar20 = (long)pOVar9->end[1];
                }
                *(int *)(lVar24 + lVar20 * 4) = iVar1;
                *(int *)(*(long *)((long)local_1a8 + (long)pOVar9->id[0] * 8) +
                        (long)pOVar9->end[0] * 4) = iVar1;
                pvVar11 = local_1a8;
                pOVar23 = local_1a0;
                if (-1 < pOVar13[lVar25 + -1].m_capacity) {
                  pOVar13[lVar25 + -1].m_count = 0;
                }
                goto LAB_00428d06;
              }
              OldReverseSegs(this_01);
              if (0 < pOVar13[(long)iVar1 + -1].m_count) {
                lVar12 = 0;
                lVar25 = 0;
                do {
                  pOVar14 = (OldCurveJoinSeg *)((long)&(pOVar13[(long)iVar1 + -1].m_a)->id + lVar12)
                  ;
                  piVar16 = *(int **)((long)local_1a8 +
                                     (long)*(int *)((long)&(pOVar13[(long)iVar1 + -1].m_a)->id +
                                                   lVar12) * 8);
                  if (0 < *piVar16) {
                    *piVar16 = iVar7;
                    piVar16 = *(int **)((long)local_1a8 + (long)pOVar14->id * 8);
                  }
                  if (0 < piVar16[1]) {
                    piVar16[1] = iVar7;
                  }
                  ON_SimpleArray<OldCurveJoinSeg>::Append(this_01,pOVar14);
                  lVar25 = lVar25 + 1;
                  lVar12 = lVar12 + 8;
                } while (lVar25 < pOVar13[(long)iVar1 + -1].m_count);
              }
LAB_004290f3:
              *(int *)(*(long *)((long)local_1a8 + (long)pOVar9->id[1] * 8) +
                      (long)pOVar9->end[1] * 4) = iVar7;
              iVar6 = pOVar9->id[0];
            }
            else {
              if (iVar2 != iVar6) {
                OldReverseSegs(SArray);
                if (0 < pOVar13[(long)iVar1 + -1].m_count) {
                  lVar12 = 0;
                  lVar25 = 0;
                  do {
                    pOVar14 = (OldCurveJoinSeg *)
                              ((long)&(pOVar13[(long)iVar1 + -1].m_a)->id + lVar12);
                    piVar16 = *(int **)((long)local_1a8 +
                                       (long)*(int *)((long)&(pOVar13[(long)iVar1 + -1].m_a)->id +
                                                     lVar12) * 8);
                    if (0 < *piVar16) {
                      *piVar16 = iVar7;
                      piVar16 = *(int **)((long)local_1a8 + (long)pOVar14->id * 8);
                    }
                    if (0 < piVar16[1]) {
                      piVar16[1] = iVar7;
                    }
                    ON_SimpleArray<OldCurveJoinSeg>::Append(this_01,pOVar14);
                    lVar25 = lVar25 + 1;
                    lVar12 = lVar12 + 8;
                  } while (lVar25 < pOVar13[(long)iVar1 + -1].m_count);
                }
                goto LAB_004290f3;
              }
              if (0 < local_120.m_a[(long)iVar1 + -1].m_count) {
                lVar12 = 0;
                lVar25 = 0;
                do {
                  pOVar14 = (OldCurveJoinSeg *)((long)&(pOVar13[(long)iVar1 + -1].m_a)->id + lVar12)
                  ;
                  piVar16 = *(int **)((long)local_1a8 +
                                     (long)*(int *)((long)&(pOVar13[(long)iVar1 + -1].m_a)->id +
                                                   lVar12) * 8);
                  if (0 < *piVar16) {
                    *piVar16 = iVar7;
                    piVar16 = *(int **)((long)local_1a8 + (long)pOVar14->id * 8);
                  }
                  if (0 < piVar16[1]) {
                    piVar16[1] = iVar7;
                  }
                  ON_SimpleArray<OldCurveJoinSeg>::Append(this_01,pOVar14);
                  lVar25 = lVar25 + 1;
                  lVar12 = lVar12 + 8;
                } while (lVar25 < pOVar13[(long)iVar1 + -1].m_count);
                lVar24 = *(long *)((long)local_1a8 + (long)pOVar9->id[1] * 8);
                lVar20 = (long)pOVar9->end[1];
              }
              *(int *)(lVar24 + lVar20 * 4) = iVar7;
              iVar6 = pOVar9->id[0];
            }
            *(int *)(*(long *)((long)local_1a8 + (long)iVar6 * 8) + (long)pOVar9->end[0] * 4) =
                 iVar7;
            pvVar11 = local_1a8;
            pOVar23 = local_1a0;
            if (-1 < pOVar13[(long)iVar1 + -1].m_capacity) {
              pOVar13[(long)iVar1 + -1].m_count = 0;
            }
          }
        }
      }
LAB_00428d06:
      local_1ac = local_1ac + 1;
    } while ((int)local_1ac < local_128._0_4_);
  }
  local_1ac = 0;
  pOVar21 = local_c8;
  if (local_120.m_count < 1) {
LAB_00429624:
    local_1ac = 0;
    iVar6 = local_180.m_count;
    if (0 < local_180.m_count) {
      do {
        piVar16 = *(int **)((long)pvVar11 + (long)(int)local_1ac * 8);
        if ((*piVar16 == 0) && (piVar16[1] == 0)) {
          if (pOVar23 != (ON_SimpleArray<int> *)0x0) {
            pOVar23->m_a[local_108.m_a[(int)local_1ac]] = pOVar21->m_count;
          }
          ON_SimpleArray<ON_Curve_*>::Append(pOVar21,local_180.m_a + (int)local_1ac);
          iVar6 = local_180.m_count;
        }
        local_1ac = local_1ac + 1;
      } while ((int)local_1ac < iVar6);
    }
    local_1ac = 0;
    if (0 < pOVar21->m_count) {
      do {
        pOVar18 = pOVar21->m_a[(int)local_1ac];
        if (((pOVar18 != (ON_Curve *)0x0) &&
            (iVar6 = (*(pOVar18->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(pOVar18),
            (char)iVar6 == '\0')) &&
           (bVar5 = ON_Curve::IsClosable(pOVar18,local_148,0.0,10.0), bVar5)) {
          ON_Curve::PointAtStart(&local_90,pOVar18);
          (*(pOVar18->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3a])(pOVar18);
        }
        local_1ac = local_1ac + 1;
      } while ((int)local_1ac < pOVar21->m_count);
    }
    onfree(pvVar11);
    onfree(local_d0);
    iVar6 = pOVar21->m_count - local_ec;
    ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_>::~ON_ClassArray(&local_120);
    ON_SimpleArray<OldCurveJoinEndData>::~ON_SimpleArray
              ((ON_SimpleArray<OldCurveJoinEndData> *)local_138);
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_c0);
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_e8);
    ON_SimpleArray<int>::~ON_SimpleArray(&local_108);
    ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray(&local_180);
    return iVar6;
  }
LAB_00429150:
  iVar6 = local_120.m_a[(int)local_1ac].m_count;
  if (1 < (long)iVar6) {
    pOVar13 = local_120.m_a + (int)local_1ac;
    if ((char)local_13c == '\0') {
      lVar25 = 0;
      iVar7 = 0;
      do {
        iVar7 = iVar7 + (uint)pOVar13->m_a[lVar25].bRev;
        lVar25 = lVar25 + 1;
      } while (iVar6 != lVar25);
      if (iVar6 < iVar7 * 2) {
        OldReverseSegs(pOVar13);
      }
    }
    this = (ON_PolyCurve *)operator_new(0x40);
    ON_PolyCurve::ON_PolyCurve(this,pOVar13->m_count);
    if (0 < pOVar13->m_count) {
      lVar12 = 0;
      local_198 = (double)CONCAT44(local_198._4_4_,0xffffffff);
      lVar25 = 1;
      local_184 = 0;
LAB_004291dd:
      pOVar14 = pOVar13->m_a;
      if (local_1a0 != (ON_SimpleArray<int> *)0x0) {
        local_1a0->m_a[local_108.m_a[pOVar14[lVar12].id]] = pOVar21->m_count;
      }
      local_190 = (ON_NurbsCurve *)local_180.m_a[pOVar14[lVar12].id];
      iVar6 = pOVar13->m_a[lVar12].id;
      iVar7 = local_198._0_4_;
      if (iVar6 < local_198._0_4_ || local_198._0_4_ < 0) {
        local_184 = (int)lVar12;
        iVar7 = iVar6;
      }
      local_198 = (double)CONCAT44(local_198._4_4_,iVar7);
      if (pOVar13->m_a[lVar12].bRev != false) {
        (*(local_190->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x38])();
      }
      iVar6 = ON_PolyCurve::Count(this);
      pOVar17 = local_190;
      if ((iVar6 == 0) ||
         (bVar5 = ON_ForceMatchCurveEnds((ON_Curve *)this,1,&local_190->super_ON_Curve,0),
         pOVar17 = local_190, bVar5)) goto LAB_004293a5;
      ON_Curve::PointAtEnd((ON_3dPoint *)local_168,(ON_Curve *)this);
      ON_Curve::PointAtStart(&local_60,&local_190->super_ON_Curve);
      ON_3dPoint::operator+(&local_48,(ON_3dPoint *)local_168,&local_60);
      operator*(&local_a8,0.5,&local_48);
      local_158 = local_a8.z;
      dStack_160 = local_a8.y;
      local_168 = (undefined1  [8])local_a8.x;
      iVar6 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3a])
                        (this);
      if (((char)iVar6 != '\0') &&
         (iVar6 = (*(local_190->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                    [0x39])(), pOVar17 = local_190, (char)iVar6 != '\0')) goto LAB_004293a5;
      pOVar17 = ON_Curve::NurbsCurve
                          (&local_190->super_ON_Curve,(ON_NurbsCurve *)0x0,0.0,(ON_Interval *)0x0);
      if (pOVar17 != (ON_NurbsCurve *)0x0) {
        iVar6 = (*(pOVar17->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x39])
                          (pOVar17);
        if ((char)iVar6 != '\0') {
          if (local_190 != (ON_NurbsCurve *)0x0) {
            (*(local_190->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
          }
          goto LAB_004293a5;
        }
        (*(pOVar17->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(pOVar17);
      }
      iVar6 = ON_PolyCurve::Count(this);
      bVar5 = iVar6 != 0;
      if (bVar5) {
        local_a8.x = (double)this;
        ON_SimpleArray<ON_Curve_*>::Append(pOVar21,(ON_Curve **)&local_a8);
      }
      if (local_1a0 != (ON_SimpleArray<int> *)0x0) {
        local_1a0->m_a[local_108.m_a[pOVar13->m_a[lVar12].id]] =
             local_1a0->m_a[local_108.m_a[pOVar13->m_a[lVar12].id]] + 1;
      }
      ON_SimpleArray<ON_Curve_*>::Append(pOVar21,(ON_Curve **)&local_190);
      for (; pvVar11 = local_1a8, lVar25 < pOVar13->m_count; lVar25 = lVar25 + 1) {
        pOVar14 = pOVar13->m_a;
        if (local_1a0 != (ON_SimpleArray<int> *)0x0) {
          local_1a0->m_a[local_108.m_a[pOVar14[lVar25].id]] = pOVar21->m_count;
        }
        ON_SimpleArray<ON_Curve_*>::Append(pOVar21,local_180.m_a + pOVar14[lVar25].id);
      }
      goto LAB_0042943e;
    }
    local_198 = (double)CONCAT44(local_198._4_4_,0xffffffff);
    bVar5 = false;
    local_184 = 0;
    goto LAB_0042943e;
  }
  goto LAB_00429557;
LAB_004293a5:
  local_190 = pOVar17;
  this_00 = ON_PolyCurve::Cast((ON_Object *)local_190);
  if (this_00 == (ON_PolyCurve *)0x0) {
    ON_PolyCurve::Append(this,&local_190->super_ON_Curve);
  }
  else {
    for (iVar6 = 0; iVar7 = ON_PolyCurve::Count(this_00), iVar6 < iVar7; iVar6 = iVar6 + 1) {
      pOVar18 = ON_PolyCurve::SegmentCurve(this_00,iVar6);
      iVar7 = (*(pOVar18->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])(pOVar18);
      if ((ON_Curve *)CONCAT44(extraout_var_00,iVar7) != (ON_Curve *)0x0) {
        ON_PolyCurve::Append(this,(ON_Curve *)CONCAT44(extraout_var_00,iVar7));
      }
    }
    (*(this_00->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(this_00);
  }
  lVar12 = lVar12 + 1;
  lVar25 = lVar25 + 1;
  pOVar21 = local_c8;
  if (pOVar13->m_count <= lVar12) goto code_r0x00429423;
  goto LAB_004291dd;
code_r0x00429423:
  bVar5 = false;
  pvVar11 = local_1a8;
LAB_0042943e:
  iVar6 = ON_PolyCurve::Count(this);
  pOVar23 = local_1a0;
  if (iVar6 == 0) {
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(this);
  }
  else if (!bVar5) {
    iVar6 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])(this);
    if ((((char)iVar6 == '\0') &&
        (bVar5 = ON_Curve::IsClosable((ON_Curve *)this,local_148,0.0,10.0), bVar5)) &&
       (bVar5 = ON_ForceMatchCurveEnds((ON_Curve *)this,0,(ON_Curve *)this,1), !bVar5)) {
      ON_Curve::PointAtStart(&local_78,(ON_Curve *)this);
      (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3a])(this);
    }
    iVar6 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])(this);
    if (((byte)iVar6 & -1 < local_198._0_4_) == 1) {
      _local_168 = ON_PolyCurve::SegmentDomain(this,local_184);
      pdVar19 = ON_Interval::operator[]((ON_Interval *)local_168,0);
      (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x27])
                (*pdVar19,this);
    }
    ON_PolyCurve::RemoveNesting(this);
    ON_PolyCurve::SynchronizeSegmentDomains(this);
    local_168 = (undefined1  [8])this;
    ON_SimpleArray<ON_Curve_*>::Append(pOVar21,(ON_Curve **)local_168);
  }
LAB_00429557:
  local_1ac = local_1ac + 1;
  if (local_120.m_count <= (int)local_1ac) goto LAB_00429624;
  goto LAB_00429150;
}

Assistant:

int 
ON_JoinCurvesOld(const ON_SimpleArray<const ON_Curve*>& InCurves,
  ON_SimpleArray<ON_Curve*>& OutCurves,
  double join_tol,
  bool bPreserveDirection, // = false
  ON_SimpleArray<int>* key //=0
)

{

  int i, count = OutCurves.Count();
  if (InCurves.Count() < 1)
    return 0;

  int dim = InCurves[0]->Dimension();
  for (i=1; i<InCurves.Count(); i++){
    if (InCurves[i]->Dimension() != dim) return 0;
  }

  if (key) {
    key->Reserve(InCurves.Count());
    for (i=0; i<InCurves.Count(); i++) key->Append(-1);
  }

  //Copy curves, take out closed curves. 
  OutCurves.Reserve(InCurves.Count());
  ON_SimpleArray<ON_Curve*> IC(InCurves.Count());
  ON_SimpleArray<int> cmap(InCurves.Count());
  for (i=0; i<InCurves.Count(); i++){
    ON_Curve* C = InCurves[i]->DuplicateCurve();
    if (!C) continue;
    if (C->IsClosed()) {
      if (key) (*key)[i] = OutCurves.Count();
      OutCurves.Append(C);
    }
    else {
      cmap.Append(i);
      IC.Append(C);
    }
  }

  //IC is a list of copies of all open curves.  match endpoints and join into polycurves.
  //copy curves that are not joined.
  ON_3dPointArray Start(IC.Count());
  Start.SetCount(IC.Count());
  ON_3dPointArray End(IC.Count());
  End.SetCount(IC.Count());
  for (i=0; i<IC.Count(); i++){
    Start[i] = IC[i]->PointAtStart();
    End[i] = IC[i]->PointAtEnd();
  }

  //get a list of all possible joins
  ON_SimpleArray<OldCurveJoinEndData> EData(IC.Count());
  for (i=0; i<IC.Count(); i++){
    int j;
    for (j=0; j<IC.Count(); j++){
      if (i==j) continue;
      double dist = Start[i].DistanceTo(End[j]);
      if (dist <= join_tol){
        OldCurveJoinEndData& ED = EData.AppendNew();
        ED.id[0] = i;
        ED.end[0] = 0;
        ED.id[1] = j;
        ED.end[1] = 1;
        ED.dist = dist;
      }
      if (!bPreserveDirection && i<j){
        dist = Start[i].DistanceTo(Start[j]);
        if (dist <= join_tol){
          OldCurveJoinEndData& ED = EData.AppendNew();
          ED.id[0] = i;
          ED.end[0] = 0;
          ED.id[1] = j;
          ED.end[1] = 0;
          ED.dist = dist;
        }
        dist = End[i].DistanceTo(End[j]);
        if (dist <= join_tol){
          OldCurveJoinEndData& ED = EData.AppendNew();
          ED.id[0] = i;
          ED.end[0] = 1;
          ED.id[1] = j;
          ED.end[1] = 1;
          ED.dist = dist;
        }
      }
    }
  }

  //sort possibilities by distance
  EData.QuickSort(OldCompareEndData);

  int* endspace = (int*)onmalloc(2*sizeof(int)*IC.Count());
  memset(endspace, 0, 2*sizeof(int)*IC.Count());
  int** endarray = (int**)onmalloc(sizeof(int*)*IC.Count());

  //endarray[i] is an int[2].  if endarray[i][0] > 0, then IC[i] is part of
  //polycurve endarray[i][0] - 1, and the start of IC[i] is interior to the polycurve.
  //if endarray[i][1] > 0, then the end of IC[i] is interior.  if both endarray[i][0] > 0
  //and endarray[i][1] > 0, then they are equal.

  for (i=0; i<IC.Count(); i++)
    endarray[i] = &endspace[2*i];

  ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg> > SegsArray(IC.Count());

  for (i=0; i<EData.Count(); i++){
    const OldCurveJoinEndData& ED = EData[i];
    if (endarray[ED.id[0]][ED.end[0]] > 0 || endarray[ED.id[1]][ED.end[1]] > 0)
      continue; //one of these endpoints has already been join to a closer end
    if (endarray[ED.id[0]][1 - ED.end[0]] == 0){
      if (endarray[ED.id[1]][1 - ED.end[1]] == 0){//new curve
        endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = SegsArray.Count()+1;
        ON_SimpleArray<OldCurveJoinSeg>& SArray = SegsArray.AppendNew();
        SArray.Reserve(4);
        OldCurveJoinSeg& Seg0 = SArray.AppendNew();
        OldCurveJoinSeg& Seg1 = SArray.AppendNew();
        if (ED.end[0]) {
          Seg0.id = ED.id[0];
          Seg0.bRev = false;
          Seg1.id = ED.id[1];
          Seg1.bRev = (ED.end[1]) ? true : false;
        }
        else {
          Seg1.id = ED.id[0];
          Seg1.bRev = false;
          Seg0.id = ED.id[1];
          Seg0.bRev = (ED.end[1]) ? false : true;
        }
      }

      else {

        //second curve is part of an existing sequence. Insert or append first curve.
        ON_SimpleArray<OldCurveJoinSeg>& SArray = SegsArray[endarray[ED.id[1]][1 - ED.end[1]] - 1];
        endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = 
          endarray[ED.id[1]][1 - ED.end[1]];

        if (SArray[0].id == ED.id[1]){
          OldCurveJoinSeg Seg;
          Seg.id = ED.id[0];
          Seg.bRev = (ED.end[0]) ? false : true;
          SArray.Insert(0, Seg);
        }
        else {
          OldCurveJoinSeg& Seg = SArray.AppendNew();
          Seg.id = ED.id[0];
          Seg.bRev = (ED.end[0]) ? true : false;
        }
      }
    }
    else if (endarray[ED.id[1]][1 - ED.end[1]] == 0){
      //first curve is part of an existing sequence. Insert or append second curve.
      ON_SimpleArray<OldCurveJoinSeg>& SArray = SegsArray[endarray[ED.id[0]][1 - ED.end[0]] - 1];
      endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = 
        endarray[ED.id[0]][1 - ED.end[0]];

      if (SArray[0].id == ED.id[0]){
        OldCurveJoinSeg Seg;
        Seg.id = ED.id[1];
        Seg.bRev = (ED.end[1]) ? false : true;
        SArray.Insert(0, Seg);
      }
      else {
        OldCurveJoinSeg& Seg = SArray.AppendNew();
        Seg.id = ED.id[1];
        Seg.bRev = (ED.end[1]) ? true : false;
      }
    }
    else {
      //both are in existing sequences.  join the sequences.
      if (endarray[ED.id[0]][1 - ED.end[0]] == endarray[ED.id[1]][1 - ED.end[1]])
        //closes off this curve
        endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = 
        endarray[ED.id[0]][1 - ED.end[0]];
      else {
        int segid0 = endarray[ED.id[0]][1 - ED.end[0]];
        int segid1 = endarray[ED.id[1]][1 - ED.end[1]];
        ON_SimpleArray<OldCurveJoinSeg>& SArray0 = SegsArray[segid0 - 1];
        ON_SimpleArray<OldCurveJoinSeg>& SArray1 = SegsArray[segid1 - 1];
        if (SArray0[0].id == ED.id[0]){
          if (SArray1[0].id == ED.id[1]){
            OldReverseSegs(SArray0);
            int j;
            for (j=0; j<SArray1.Count(); j++){
              if (endarray[SArray1[j].id][0] > 0) endarray[SArray1[j].id][0] = segid0;
              if (endarray[SArray1[j].id][1] > 0) endarray[SArray1[j].id][1] = segid0;
              SArray0.Append(SArray1[j]);
            }
            endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = segid0;
            SArray1.SetCount(0);
          }
          else {
            int j;
            for (j=0; j<SArray0.Count(); j++){
              if (endarray[SArray0[j].id][0] > 0) endarray[SArray0[j].id][0] = segid1;
              if (endarray[SArray0[j].id][1] > 0) endarray[SArray0[j].id][1] = segid1;
              SArray1.Append(SArray0[j]);
            }
            endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = segid1;
            SArray0.SetCount(0);
          }
        }
        else if (SArray1[0].id == ED.id[1]){
          int j;
          for (j=0; j<SArray1.Count(); j++){
            if (endarray[SArray1[j].id][0] > 0) endarray[SArray1[j].id][0] = segid0;
            if (endarray[SArray1[j].id][1] > 0) endarray[SArray1[j].id][1] = segid0;
            SArray0.Append(SArray1[j]);
          }
          endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = segid0;
          SArray1.SetCount(0);
        }
        else {
          OldReverseSegs(SArray1);
          int j;
          for (j=0; j<SArray1.Count(); j++) {
            if (endarray[SArray1[j].id][0] > 0) endarray[SArray1[j].id][0] = segid0;
            if (endarray[SArray1[j].id][1] > 0) endarray[SArray1[j].id][1] = segid0;
            SArray0.Append(SArray1[j]);
          }
          endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = segid0;
          SArray1.SetCount(0);
        }
      }
    }
  }

  //make polycurves out of sequences

  for (i=0; i<SegsArray.Count(); i++){
    ON_SimpleArray<OldCurveJoinSeg>& SArray = SegsArray[i];
    if (SArray.Count() < 2) continue;
    if (!bPreserveDirection){//if number of reversed segs is more than half, reverse.
      int scount= 0;
      int j;
      for (j=0; j<SArray.Count(); j++) {
        if (SArray[j].bRev)
          scount++;
      }
      if (2*scount > SArray.Count())
        OldReverseSegs(SArray);
    }
    ON_PolyCurve* PC = new ON_PolyCurve(SArray.Count());
    bool pc_added = false;
    int j;
    int min_seg = 0;
    int min_id = -1;
    for (j=0; j<SArray.Count(); j++){
      if (key) 
        (*key)[cmap[SArray[j].id]] = OutCurves.Count();
      ON_Curve* C = IC[SArray[j].id];
      if (min_id < 0 || SArray[j].id < min_id){
        min_id = SArray[j].id;
        min_seg = j;
      }
      if (SArray[j].bRev) C->Reverse();
      if (PC->Count()){
        bool bSet = true;
        if (!ON_ForceMatchCurveEnds(*PC, 1, *C, 0)) {
          ON_3dPoint P = PC->PointAtEnd();
          ON_3dPoint Q = C->PointAtStart();
          P = 0.5*(P+Q);
          if (!PC->SetEndPoint(P) || !C->SetStartPoint(P)) {
            ON_NurbsCurve* NC = C->NurbsCurve();
            if (NC && NC->SetStartPoint(P)){
              delete C;
              C = NC;
            }
            else {
              bSet = false;
              delete NC;
              if (PC->Count()) {
                pc_added = true;
                OutCurves.Append(PC);
              }
              if (key)
                (*key)[cmap[SArray[j].id]]++;
              OutCurves.Append(C);
              int k;
              for (k=j+1; k<SArray.Count(); k++){
                if (key)
                  (*key)[cmap[SArray[k].id]] = OutCurves.Count();
                OutCurves.Append(IC[SArray[k].id]);
              }
              break;
            }
          }
        }
      }
      ON_PolyCurve* pPoly = ON_PolyCurve::Cast(C);
      if( pPoly){
        int si;
        for (si=0; si<pPoly->Count(); si++){
          const ON_Curve* SC = pPoly->SegmentCurve(si);
          ON_Curve* SCCopy = SC->DuplicateCurve();
          if (SCCopy) PC->Append(SCCopy);
        }
        delete pPoly;
      }
      else PC->Append(C);
    }
    if (!PC->Count()) delete PC;
    else if (!pc_added) {
      if (!PC->IsClosed() && PC->IsClosable(join_tol)){
        if (!ON_ForceMatchCurveEnds(*PC, 0, *PC, 1))
          PC->SetEndPoint(PC->PointAtStart());
      }
      if (PC->IsClosed() && min_id >= 0){
        //int sc = PC->SpanCount();
        double t = PC->SegmentDomain(min_seg)[0];
        PC->ChangeClosedCurveSeam(t);
      }

      // 28 October 2010 Dale Lear
      //    I added the RemoveNesting() and SynchronizeSegmentDomains()
      //    lines so Rhino will create higher quality geometry.
      PC->RemoveNesting();
      PC->SynchronizeSegmentDomains();

      OutCurves.Append(PC);
    }
  }

  //add in singletons
  for (i=0; i<IC.Count(); i++){
    if (endarray[i][0] == 0 && endarray[i][1] == 0){
      if (key) (*key)[cmap[i]] = OutCurves.Count();
      OutCurves.Append(IC[i]);
    }
  }

  /* This was added by greg to fix big curves that are nearly, but not quite, closed.
  It causes problems when the curve is tiny.
  for(i=0; i<OutCurves.Count(); i++){
  if(!OutCurves[i]->IsClosed()){
  ON_3dPoint s= OutCurves[i]->PointAtStart();
  ON_3dPoint e = OutCurves[i]->PointAtEnd();
  if(s.DistanceTo(e)<join_tol)
  OutCurves[i]->SetEndPoint( s );			
  }
  }
  */

  //Chuck added this, 1/16/03.
  for(i=0; i<OutCurves.Count(); i++){
    ON_Curve* C = OutCurves[i];
    if (!C || C->IsClosed()) continue;
    if (C->IsClosable(join_tol))
      C->SetEndPoint(C->PointAtStart());
  }

  onfree((void*)endarray);
  onfree((void*)endspace);

  return OutCurves.Count() - count;
}